

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

VariableSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation&,slang::ast::VariableLifetime>
          (BumpAllocator *this,char (*args) [5],SourceLocation *args_1,VariableLifetime *args_2)

{
  VariableSymbol *this_00;
  size_t sVar1;
  string_view name;
  
  this_00 = (VariableSymbol *)allocate(this,0x158,8);
  sVar1 = strlen(*args);
  name._M_str = *args;
  name._M_len = sVar1;
  ast::VariableSymbol::VariableSymbol(this_00,name,*args_1,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }